

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int read_dns_questions(question *question,char *message)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = *(ushort *)(message + 4);
  iVar2 = read_dns_question(question,message + 0xc,message);
  question->qclass =
       *(ushort *)(message + (long)iVar2 + 0xe) << 8 | *(ushort *)(message + (long)iVar2 + 0xe) >> 8
  ;
  question->qtype =
       *(ushort *)(message + (long)iVar2 + 0xc) << 8 | *(ushort *)(message + (long)iVar2 + 0xc) >> 8
  ;
  return (int)(ushort)(uVar1 << 8 | uVar1 >> 8);
}

Assistant:

int read_dns_questions(struct question *question, char *message) {
  //读取报文中的问题
  struct dns_header *header;
  header = (struct dns_header *)message;
  unsigned short question_num = ntohs(header->qdcount);
  char *data = message + DNS_HEADER_SIZE;
  //一般只会有1个question
  data += read_dns_question(question, data, message);
  struct question_struct *q = (struct question_struct *)data;
  question->qclass = ntohs(q->qclass);
  question->qtype = ntohs(q->qtype);
  return question_num;
}